

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O3

void mi_segment_commit_mask
               (mi_segment_t *segment,_Bool conservative,uint8_t *p,size_t size,uint8_t **start_p,
               size_t *full_size,mi_commit_mask_t *cm)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  cm->mask[6] = 0;
  cm->mask[7] = 0;
  cm->mask[4] = 0;
  cm->mask[5] = 0;
  cm->mask[2] = 0;
  cm->mask[3] = 0;
  cm->mask[0] = 0;
  cm->mask[1] = 0;
  if (((0xfffffffffdffffff < size - 0x2000001) && (segment->kind != MI_SEGMENT_HUGE)) &&
     (uVar3 = segment->segment_slices * 0x10000, p < (uint8_t *)((long)segment + uVar3))) {
    uVar6 = segment->segment_info_slices << 0x10;
    uVar7 = (long)p - (long)segment;
    uVar5 = uVar7 + 0xffff;
    sVar1 = size;
    if (!conservative) {
      uVar5 = uVar7;
      sVar1 = size + 0xffff;
    }
    uVar5 = uVar5 & 0xffffffffffff0000;
    uVar4 = sVar1 + uVar7 & 0xffffffffffff0000;
    uVar2 = uVar6;
    if (uVar6 < uVar5) {
      uVar2 = uVar5;
    }
    if (uVar7 < uVar6) {
      uVar2 = uVar5;
    }
    if (uVar3 <= uVar4) {
      uVar4 = uVar3;
    }
    *start_p = (uint8_t *)((long)(segment->purge_mask).mask + (uVar2 - 0x38));
    uVar3 = 0;
    if (uVar2 <= uVar4) {
      uVar3 = uVar4 - uVar2;
    }
    *full_size = uVar3;
    if (uVar2 <= uVar4 && uVar4 - uVar2 != 0) {
      uVar5 = uVar2 >> 0x10;
      uVar6 = uVar3 >> 0x10;
      if (0x200 < uVar6 + uVar5) {
        _mi_warning_message("commit mask overflow: idx=%zu count=%zu start=%zx end=%zx p=0x%p size=%zu fullsize=%zu\n"
                            ,uVar5,uVar6,uVar2,uVar4,p,size,uVar3);
      }
      mi_commit_mask_create(uVar5,uVar6,cm);
      return;
    }
  }
  return;
}

Assistant:

static void mi_segment_commit_mask(mi_segment_t* segment, bool conservative, uint8_t* p, size_t size, uint8_t** start_p, size_t* full_size, mi_commit_mask_t* cm) {
  mi_assert_internal(_mi_ptr_segment(p + 1) == segment);
  mi_assert_internal(segment->kind != MI_SEGMENT_HUGE);
  mi_commit_mask_create_empty(cm);
  if (size == 0 || size > MI_SEGMENT_SIZE || segment->kind == MI_SEGMENT_HUGE) return;
  const size_t segstart = mi_segment_info_size(segment);
  const size_t segsize = mi_segment_size(segment);
  if (p >= (uint8_t*)segment + segsize) return;

  size_t pstart = (p - (uint8_t*)segment);
  mi_assert_internal(pstart + size <= segsize);

  size_t start;
  size_t end;
  if (conservative) {
    // decommit conservative
    start = _mi_align_up(pstart, MI_COMMIT_SIZE);
    end   = _mi_align_down(pstart + size, MI_COMMIT_SIZE);
    mi_assert_internal(start >= segstart);
    mi_assert_internal(end <= segsize);
  }
  else {
    // commit liberal
    start = _mi_align_down(pstart, MI_MINIMAL_COMMIT_SIZE);
    end   = _mi_align_up(pstart + size, MI_MINIMAL_COMMIT_SIZE);
  }
  if (pstart >= segstart && start < segstart) {  // note: the mask is also calculated for an initial commit of the info area
    start = segstart;
  }
  if (end > segsize) {
    end = segsize;
  }

  mi_assert_internal(start <= pstart && (pstart + size) <= end);
  mi_assert_internal(start % MI_COMMIT_SIZE==0 && end % MI_COMMIT_SIZE == 0);
  *start_p   = (uint8_t*)segment + start;
  *full_size = (end > start ? end - start : 0);
  if (*full_size == 0) return;

  size_t bitidx = start / MI_COMMIT_SIZE;
  mi_assert_internal(bitidx < MI_COMMIT_MASK_BITS);

  size_t bitcount = *full_size / MI_COMMIT_SIZE; // can be 0
  if (bitidx + bitcount > MI_COMMIT_MASK_BITS) {
    _mi_warning_message("commit mask overflow: idx=%zu count=%zu start=%zx end=%zx p=0x%p size=%zu fullsize=%zu\n", bitidx, bitcount, start, end, p, size, *full_size);
  }
  mi_assert_internal((bitidx + bitcount) <= MI_COMMIT_MASK_BITS);
  mi_commit_mask_create(bitidx, bitcount, cm);
}